

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFieldSwitch
          (ParseFunctionGenerator *this,Formatter *format,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *ordered_fields)

{
  int iVar1;
  FieldDescriptor *field;
  bool bVar2;
  Type TVar3;
  LogMessage *other;
  WireType WVar4;
  pointer ppFVar5;
  WireType WVar6;
  WireType WVar7;
  WireType WVar8;
  int tag_size;
  WireType local_7c;
  ParseFunctionGenerator *local_78;
  pointer local_70;
  uint32_t tag;
  
  Formatter::operator()<>(format,"switch (tag >> 3) {\n");
  Formatter::Indent(format);
  local_70 = (ordered_fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  for (ppFVar5 = (ordered_fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppFVar5 != local_70;
      ppFVar5 = ppFVar5 + 1) {
    field = *ppFVar5;
    PrintFieldComment<google::protobuf::FieldDescriptor>(format,field);
    tag = *(uint32_t *)(field + 4);
    Formatter::operator()(format,"case $1$:\n",(int *)&tag);
    Formatter::Indent(format);
    bVar2 = FieldDescriptor::is_packable(field);
    if (bVar2) {
      TVar3 = FieldDescriptor::type(field);
      WVar8 = *(WireType *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4);
      iVar1 = *(int *)(field + 4);
      WVar6 = iVar1 << 3;
      if (WVar8 == WIRETYPE_LENGTH_DELIMITED) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&tag,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                   ,0x3b9);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)&tag,
                           "CHECK failed: expected_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED: "
                          );
        internal::LogFinisher::operator=((LogFinisher *)&tag_size,other);
        internal::LogMessage::~LogMessage((LogMessage *)&tag);
        WVar6 = *(int *)(field + 4) << 3;
      }
      WVar8 = iVar1 << 3 | WVar8;
      bVar2 = FieldDescriptor::is_packed(field);
      this = local_78;
      WVar4 = WVar8;
      WVar7 = WVar6 | WIRETYPE_LENGTH_DELIMITED;
      if (bVar2) {
        WVar4 = WVar6 | WIRETYPE_LENGTH_DELIMITED;
        WVar7 = WVar8;
      }
    }
    else {
      WVar4 = internal::WireFormat::WireTypeForField(field);
      WVar4 = *(int *)(field + 4) << 3 | WVar4;
      WVar7 = WIRETYPE_VARINT;
    }
    tag = WVar4 & 0xff;
    Formatter::operator()
              (format,"if (PROTOBUF_PREDICT_TRUE(static_cast<$uint8$>(tag) == $1$)) {\n",&tag);
    Formatter::Indent(format);
    WVar4 = WVar4 & (WIRETYPE_END_GROUP|WIRETYPE_START_GROUP);
    tag = WVar4 + *(int *)(field + 4) * 8;
    iVar1 = 0x1f;
    if ((tag | 1) != 0) {
      for (; (tag | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    tag_size = iVar1 * 9 + 0x49U >> 6;
    if (((0x7ff < *(int *)(field + 4)) || ((~(byte)field[1] & 0x60) != 0)) ||
       (bVar2 = FieldDescriptor::is_packable(field), WVar4 == WIRETYPE_LENGTH_DELIMITED && bVar2)) {
      GenerateFieldBody(this,format,WVar4,field);
    }
    else {
      Formatter::operator()(format,"ptr -= $1$;\ndo {\n  ptr += $1$;\n",&tag_size);
      Formatter::Indent(format);
      GenerateFieldBody(this,format,WVar4,field);
      Formatter::Outdent(format);
      Formatter::operator()
                (format,
                 "  if (!ctx->DataAvailable(ptr)) break;\n} while (::$proto_ns$::internal::ExpectTag<$1$>(ptr));\n"
                 ,&tag);
    }
    Formatter::Outdent(format);
    if (WVar7 != WIRETYPE_VARINT) {
      local_7c = WVar7 & 0xff;
      Formatter::operator()(format,"} else if (static_cast<$uint8$>(tag) == $1$) {\n",&local_7c);
      Formatter::Indent(format);
      GenerateFieldBody(this,format,WVar7 & (WIRETYPE_END_GROUP|WIRETYPE_START_GROUP),field);
      Formatter::Outdent(format);
    }
    Formatter::operator()<>(format,"} else\n  goto handle_unusual;\n$next_tag$;\n");
    Formatter::Outdent(format);
  }
  Formatter::operator()<>(format,"default:\n  goto handle_unusual;\n");
  Formatter::Outdent(format);
  Formatter::operator()<>(format,"}  // switch\n");
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFieldSwitch(
    Formatter& format,
    const std::vector<const FieldDescriptor*>& ordered_fields) {
  format("switch (tag >> 3) {\n");
  format.Indent();

  for (const auto* field : ordered_fields) {
    PrintFieldComment(format, field);
    format("case $1$:\n", field->number());
    format.Indent();
    uint32_t fallback_tag = 0;
    uint32_t expected_tag = ExpectedTag(field, &fallback_tag);
    format("if (PROTOBUF_PREDICT_TRUE(static_cast<$uint8$>(tag) == $1$)) {\n",
           expected_tag & 0xFF);
    format.Indent();
    auto wiretype = WireFormatLite::GetTagWireType(expected_tag);
    uint32_t tag = WireFormatLite::MakeTag(field->number(), wiretype);
    int tag_size = io::CodedOutputStream::VarintSize32(tag);
    bool is_repeat = ShouldRepeat(field, wiretype);
    if (is_repeat) {
      format(
          "ptr -= $1$;\n"
          "do {\n"
          "  ptr += $1$;\n",
          tag_size);
      format.Indent();
    }
    GenerateFieldBody(format, wiretype, field);
    if (is_repeat) {
      format.Outdent();
      format(
          "  if (!ctx->DataAvailable(ptr)) break;\n"
          "} while (::$proto_ns$::internal::ExpectTag<$1$>(ptr));\n",
          tag);
    }
    format.Outdent();
    if (fallback_tag) {
      format("} else if (static_cast<$uint8$>(tag) == $1$) {\n",
             fallback_tag & 0xFF);
      format.Indent();
      GenerateFieldBody(format, WireFormatLite::GetTagWireType(fallback_tag),
                        field);
      format.Outdent();
    }
    format(
        "} else\n"
        "  goto handle_unusual;\n"
        "$next_tag$;\n");
    format.Outdent();
  }  // for loop over ordered fields

  format(
      "default:\n"
      "  goto handle_unusual;\n");
  format.Outdent();
  format("}  // switch\n");
}